

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

int __thiscall
clunk::Node::Search<(clunk::NodeType)1,true>(Node *this,int alpha,int beta,int depth,bool cutNode)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  int *piVar6;
  uint32_t *puVar7;
  uint64_t uVar8;
  Move *other;
  uint32_t local_d8;
  uint32_t local_d0;
  bool local_c5;
  uint32_t local_c0;
  uint32_t local_b8;
  uint32_t local_b4;
  bool local_79;
  int local_70;
  int local_6c;
  Move *pMStack_68;
  int d;
  Move *move;
  int local_58;
  int iStack_54;
  bool lmrOK;
  int local_50;
  int pvDepth;
  int orig_alpha;
  int rdepth;
  HashEntry *entry;
  Move firstMove;
  int eval;
  uint32_t uStack_2c;
  bool pvNode;
  byte local_25;
  int best;
  uint32_t uStack_20;
  bool cutNode_local;
  int depth_local;
  int beta_local;
  int alpha_local;
  Node *this_local;
  
  local_25 = cutNode;
  best = depth;
  uStack_20 = beta;
  depth_local = alpha;
  _beta_local = this;
  if (this->parent == (Node *)0x0) {
    __assert_fail("parent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf6d,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  if (this->ply < 1) {
    __assert_fail("ply > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf6e,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  if (beta <= alpha) {
    __assert_fail("alpha < beta",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf6f,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  iVar5 = alpha;
  if (alpha < 1) {
    iVar5 = -alpha;
  }
  if (32000 < iVar5) {
    __assert_fail("abs(alpha) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf70,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  iVar5 = beta;
  if (beta < 1) {
    iVar5 = -beta;
  }
  if (32000 < iVar5) {
    __assert_fail("abs(beta) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf71,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  if (depth < 1) {
    __assert_fail("depth > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf72,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  if (alpha + 1 != beta) {
    __assert_fail("(type == PV) | ((alpha + 1) == beta)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf73,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  if (cutNode) {
    local_79 = Move::IsValid(&this->lastMove);
  }
  else {
    local_79 = true;
  }
  if (local_79 == false) {
    __assert_fail("cutNode ? lastMove.IsValid() : true",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf74,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  DAT_001aab60 = DAT_001aab60 + 1;
  this->moveIndex = 0;
  this->moveCount = 0;
  this->pvCount = 0;
  this->depthChange = 0;
  bVar1 = IsDraw(this);
  iVar5 = DAT_001a9af4;
  if (bVar1) {
    this->standPat = DAT_001a9af4;
    return iVar5;
  }
  uStack_2c = this->ply + -32000;
  piVar6 = std::max<int>((int *)&stack0xffffffffffffffd4,&depth_local);
  depth_local = *piVar6;
  eval = 0x7d01 - this->ply;
  puVar7 = (uint32_t *)std::min<int>(&eval,(int *)&stack0xffffffffffffffe0);
  uStack_20 = *puVar7;
  if ((int)uStack_20 <= depth_local || this->child == (Node *)0x0) {
    return depth_local;
  }
  if ((this->checks != 0) && (this->parent->depthChange < 1)) {
    DAT_001aab70 = DAT_001aab70 + 1;
    this->depthChange = this->depthChange + 1;
    best = best + 1;
  }
  firstMove.score._3_1_ = 0;
  firstMove.bits = 32000;
  Move::Move((Move *)&entry,0,0);
  _orig_alpha = TranspositionTable<clunk::HashEntry>::Get
                          ((TranspositionTable<clunk::HashEntry> *)_tt,this->positionKey);
  uVar8 = HashEntry::Key(_orig_alpha);
  if (uVar8 == this->positionKey) {
    TranspositionTable<clunk::HashEntry>::IncHits((TranspositionTable<clunk::HashEntry> *)_tt);
    iVar3 = HashEntry::GetPrimaryFlag(_orig_alpha);
    iVar5 = DAT_001a9af4;
    switch(iVar3) {
    case 1:
      return this->ply + -32000;
    case 2:
      this->standPat = DAT_001a9af4;
      return iVar5;
    case 3:
      uVar4 = HashEntry::MoveBits(_orig_alpha);
      iVar5 = HashEntry::Score(_orig_alpha,this->ply);
      Move::Init((Move *)&entry,uVar4,iVar5);
      iVar5 = ValidateMove<true>(this,(Move *)&entry);
      if (iVar5 != 0) {
        __assert_fail("ValidateMove<color>(firstMove) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf9c,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                     );
      }
      HashEntry::HasPvFlag(_orig_alpha);
      iVar5 = HashEntry::Depth(_orig_alpha);
      bVar1 = best <= iVar5;
      iVar5 = Move::GetScore((Move *)&entry);
      if (bVar1 && iVar5 <= depth_local) {
        Move::operator=(this->pv,(Move *)&entry);
        this->pvCount = 1;
        iVar5 = Move::GetScore((Move *)&entry);
        return iVar5;
      }
      firstMove.bits = Move::GetScore((Move *)&entry);
      break;
    case 4:
      uVar4 = HashEntry::MoveBits(_orig_alpha);
      iVar5 = HashEntry::Score(_orig_alpha,this->ply);
      Move::Init((Move *)&entry,uVar4,iVar5);
      iVar5 = ValidateMove<true>(this,(Move *)&entry);
      if (iVar5 != 0) {
        __assert_fail("ValidateMove<color>(firstMove) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xfa8,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                     );
      }
      bVar1 = HashEntry::HasPvFlag(_orig_alpha);
      if (!bVar1) {
        __assert_fail("entry->HasPvFlag()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xfa9,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                     );
      }
      iVar5 = HashEntry::Depth(_orig_alpha);
      bVar1 = best <= iVar5;
      Move::GetScore((Move *)&entry);
      Move::GetScore((Move *)&entry);
      if (bVar1) {
        Move::operator=(this->pv,(Move *)&entry);
        this->pvCount = 1;
        iVar5 = Move::GetScore((Move *)&entry);
        if (iVar5 < (int)uStack_20) {
          iVar5 = this->checks;
          iVar3 = Move::GetScore((Move *)&entry);
          bVar1 = depth_local < iVar3;
          bVar2 = Move::IsCapOrPromo((Move *)&entry);
          if (((iVar5 == 0 && bVar1) & (bVar2 ^ 0xffU) & 1) != 0) {
            IncHistory((Move *)&entry,best);
          }
        }
        else {
          AddKiller(this,(Move *)&entry,best);
        }
        iVar5 = Move::GetScore((Move *)&entry);
        return iVar5;
      }
      firstMove.bits = Move::GetScore((Move *)&entry);
      break;
    case 5:
      uVar4 = HashEntry::MoveBits(_orig_alpha);
      iVar5 = HashEntry::Score(_orig_alpha,this->ply);
      Move::Init((Move *)&entry,uVar4,iVar5);
      iVar5 = ValidateMove<true>(this,(Move *)&entry);
      if (iVar5 != 0) {
        __assert_fail("ValidateMove<color>(firstMove) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xfbf,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                     );
      }
      HashEntry::HasPvFlag(_orig_alpha);
      iVar5 = HashEntry::Depth(_orig_alpha);
      bVar1 = best <= iVar5;
      iVar5 = Move::GetScore((Move *)&entry);
      if (bVar1 && (int)uStack_20 <= iVar5) {
        Move::operator=(this->pv,(Move *)&entry);
        this->pvCount = 1;
        AddKiller(this,(Move *)&entry,best);
        iVar5 = Move::GetScore((Move *)&entry);
        return iVar5;
      }
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xfca,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                   );
    }
    if ((this->depthChange < 1 && this->parent->depthChange < 1) &&
       (bVar1 = HashEntry::HasExtendedFlag(_orig_alpha), bVar1)) {
      DAT_001aab80 = DAT_001aab80 + 1;
      this->depthChange = this->depthChange + 1;
      best = best + 1;
    }
  }
  if (this->depthChange < 0) {
    __assert_fail("depthChange >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd5,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  if (this->moveIndex != 0) {
    __assert_fail("!moveIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd6,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  if (this->moveCount != 0) {
    __assert_fail("!moveCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd7,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  if (this->pvCount != 0) {
    __assert_fail("!pvCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd8,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  if (((((local_25 & 1 & this->depthChange == 0 & this->checks == 0) != 0) &&
       (bVar1 = IsKiller(this,&this->lastMove), !bVar1)) && (1 < DAT_00194984 + DAT_00194994)) &&
     (2 < DAT_00194984 + DAT_00194994 + DAT_0019498c)) {
    if (depth_local + 1U != uStack_20) {
      __assert_fail("(alpha + 1) == beta",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xfe0,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                   );
    }
    Evaluate(this);
    puVar7 = (uint32_t *)std::min<int>((int *)&firstMove,&this->standPat);
    firstMove.bits = *puVar7;
    if (best == 1) {
      uVar4 = uStack_20;
      if ((int)uStack_20 < 1) {
        uVar4 = -uStack_20;
      }
      if ((int)(uStack_20 + 300) <= (int)firstMove.bits && (int)uVar4 < 20000) {
        DAT_001aaba0 = DAT_001aaba0 + 1;
        this->depthChange = -1;
        return uStack_20;
      }
    }
    else if ((int)uStack_20 <= (int)firstMove.bits) {
      ExecNullMove<true>(this,this->child);
      pvDepth = ((best + -3) - best / 6) - (uint)((int)uStack_20 <= (int)(firstMove.bits - 500));
      if (pvDepth < 1) {
        iVar5 = QSearch<false>(this->child,-uStack_20,-depth_local,0);
      }
      else {
        iVar5 = Search<(clunk::NodeType)1,false>(this->child,-uStack_20,-depth_local,pvDepth,false);
      }
      local_b4 = -iVar5;
      firstMove.bits = local_b4;
      if (_stop != 0) {
        return uStack_20;
      }
      if ((int)uStack_20 <= (int)local_b4) {
        DAT_001aabd0 = DAT_001aabd0 + 1;
        this->depthChange = -best;
        piVar6 = std::max<int>(&this->standPat,(int *)&stack0xffffffffffffffe0);
        return *piVar6;
      }
    }
  }
  if (this->moveIndex != 0) {
    __assert_fail("!moveIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfff,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                 );
  }
  if (this->moveCount == 0) {
    bVar1 = Move::operator!((Move *)&entry);
    if (bVar1 && 3 < best) {
      if (this->moveCount != 0) {
        __assert_fail("!moveCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1004,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                     );
      }
      if (this->pvCount != 0) {
        __assert_fail("!pvCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1005,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                     );
      }
      DAT_001aabc0 = DAT_001aabc0 + 1;
      firstMove.bits = Search<(clunk::NodeType)1,true>(this,uStack_20 - 1,uStack_20,best + -2,false)
      ;
      if (_stop != 0 || this->pvCount == 0) {
        return firstMove.bits;
      }
      if (this->moveCount < 1) {
        __assert_fail("moveCount > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x100b,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                     );
      }
      if (this->pvCount < 1) {
        __assert_fail("pvCount > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x100c,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                     );
      }
      bVar1 = Move::IsValid(this->pv);
      if (!bVar1) {
        __assert_fail("pv[0].IsValid()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x100d,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                     );
      }
      Move::operator=((Move *)&entry,this->pv);
      this->moveIndex = 1;
    }
    else {
      bVar1 = Move::operator!((Move *)&entry);
      if (bVar1) {
        if (this->moveCount != 0) {
          __assert_fail("!moveCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x1014,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                       );
        }
        if (this->pvCount != 0) {
          __assert_fail("!pvCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x1015,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                       );
        }
        GenerateMoves<true,false>(this,best);
        if (this->moveCount < 1) {
          if (this->checks != 0) {
            HashEntry::SetCheckmate(_orig_alpha,this->positionKey);
            TranspositionTable<clunk::HashEntry>::IncCheckmates
                      ((TranspositionTable<clunk::HashEntry> *)_tt);
            return this->ply + -32000;
          }
          HashEntry::SetStalemate(_orig_alpha,this->positionKey);
          TranspositionTable<clunk::HashEntry>::IncStalemates
                    ((TranspositionTable<clunk::HashEntry> *)_tt);
          iVar5 = DAT_001a9af4;
          this->standPat = DAT_001a9af4;
          return iVar5;
        }
        other = GetNextMove(this);
        Move::operator=((Move *)&entry,other);
        if (this->moveIndex != 1) {
          __assert_fail("moveIndex == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x1023,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                       );
        }
      }
    }
    if ((this->moveCount == 1 && this->depthChange < 1) && this->parent->depthChange < 1) {
      DAT_001aab78 = DAT_001aab78 + 1;
      this->depthChange = this->depthChange + 1;
      best = best + 1;
    }
    local_50 = depth_local;
    Exec<true>(this,(Move *)&entry,this->child);
    if (best < 2) {
      iVar5 = QSearch<false>(this->child,-uStack_20,-depth_local,0);
    }
    else {
      iVar5 = Search<(clunk::NodeType)1,false>
                        (this->child,-uStack_20,-depth_local,best + -1,(bool)((local_25 ^ 0xff) & 1)
                        );
    }
    local_b8 = -iVar5;
    uStack_2c = local_b8;
    Undo<true>(this,(Move *)&entry);
    iStack_54 = best;
    if (_stop == 0) {
      local_58 = 0;
      piVar6 = std::min<int>(&local_58,&this->child->depthChange);
      iStack_54 = iStack_54 + *piVar6;
      UpdatePV(this,(Move *)&entry);
      if ((int)uStack_2c < (int)uStack_20) {
        if (depth_local < (int)uStack_2c) {
          if (iStack_54 != best) {
            __assert_fail("pvDepth == depth",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x1044,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                         );
          }
          depth_local = uStack_2c;
        }
        else {
          iVar5 = this->checks;
          bVar1 = Move::IsCapOrPromo((Move *)&entry);
          if (iVar5 == 0 && !bVar1) {
            DecHistory((Move *)&entry);
          }
        }
        if (this->moveCount < 1) {
          GenerateMoves<true,false>(this,best);
          if (this->moveCount < 1) {
            __assert_fail("moveCount > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x104e,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                         );
          }
          if (this->moveCount == 1) {
            local_c5 = Move::operator==(this->moves,(Move *)&entry);
          }
          else {
            local_c5 = true;
          }
          if (local_c5 == false) {
            __assert_fail("(moveCount == 1) ? (moves[0] == firstMove) : true",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x104f,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                         );
          }
        }
        if (1 < this->moveIndex) {
          __assert_fail("moveIndex <= 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x1052,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                       );
        }
        if (this->moveCount < this->moveIndex) {
          __assert_fail("moveIndex <= moveCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x1053,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                       );
        }
        move._7_1_ = 2 < best && this->checks == 0;
        while (pMStack_68 = GetNextMove(this), pMStack_68 != (Move *)0x0) {
          bVar1 = Move::IsValid(pMStack_68);
          if (!bVar1) {
            __assert_fail("move->IsValid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x1059,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                         );
          }
          bVar1 = Move::operator==((Move *)&entry,pMStack_68);
          if (!bVar1) {
            DAT_001aabf0 = DAT_001aabf0 + 1;
            Exec<true>(this,pMStack_68,this->child);
            local_6c = best + -1;
            if ((move._7_1_ & 1) != 0) {
              DAT_001aabf8 = DAT_001aabf8 + 1;
              bVar1 = Move::IsCapOrPromo(pMStack_68);
              bVar2 = IsKiller(this,pMStack_68);
              if (((!bVar1 && !bVar2) && this->child->checks == 0) &&
                 (iVar5 = Move::TypeToIndex(pMStack_68), (char)_hist[iVar5] < best)) {
                DAT_001aac00 = DAT_001aac00 + 1;
                iVar5 = Move::TypeToIndex(pMStack_68);
                local_6c = local_6c - (((char)_hist[iVar5] < '\0') + 1);
              }
            }
            if (local_6c < 1) {
              iVar5 = QSearch<false>(this->child,-(depth_local + 1),-depth_local,0);
            }
            else {
              iVar5 = Search<(clunk::NodeType)1,false>
                                (this->child,-(depth_local + 1),-depth_local,local_6c,true);
            }
            local_d0 = -iVar5;
            firstMove.bits = local_d0;
            if (_stop == 0 && depth_local < (int)local_d0) {
              if (this->child->depthChange < 0) {
                __assert_fail("child->depthChange >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x1074,
                              "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                             );
              }
              DAT_001aac18 = DAT_001aac18 + 1;
              if (local_6c < best + -1) {
                if (depth_local + 1U != uStack_20) {
                  __assert_fail("(alpha + 1) == beta",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                                ,0x107e,
                                "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                               );
                }
                DAT_001aac08 = DAT_001aac08 + 1;
                local_6c = best + -1;
                iVar5 = Search<(clunk::NodeType)1,false>
                                  (this->child,-uStack_20,-depth_local,local_6c,false);
                firstMove.bits = -iVar5;
              }
              _DAT_001aac10 = (ulong)(depth_local < (int)firstMove.bits) + _DAT_001aac10;
            }
            if (best + this->child->depthChange < 0) {
              __assert_fail("(depth + child->depthChange) >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x1086,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                           );
            }
            Undo<true>(this,pMStack_68);
            iVar5 = best;
            if (_stop != 0) {
              return uStack_20;
            }
            if ((int)uStack_2c < (int)firstMove.bits) {
              uStack_2c = firstMove.bits;
              local_70 = 0;
              piVar6 = std::min<int>(&local_70,&this->child->depthChange);
              iStack_54 = iVar5 + *piVar6;
              UpdatePV(this,pMStack_68);
              if ((int)uStack_20 <= (int)firstMove.bits) {
                if (iStack_54 == best) {
                  AddKiller(this,pMStack_68,iStack_54);
                  uVar4 = uStack_2c;
                  if ((int)uStack_2c < 1) {
                    uVar4 = -uStack_2c;
                  }
                  if ((int)uVar4 < 0x7919) {
                    local_d8 = uStack_20;
                  }
                  else {
                    local_d8 = uStack_2c;
                  }
                  firstMove.bits = local_d8;
                  iVar5 = 0;
                  if (0 < this->depthChange) {
                    iVar5 = 8;
                  }
                  HashEntry::Set(_orig_alpha,this->positionKey,pMStack_68,local_d8,this->ply,
                                 iStack_54,5,iVar5);
                  return uStack_2c;
                }
                __assert_fail("pvDepth == depth",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x1090,
                              "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                             );
              }
            }
            if (depth_local < (int)firstMove.bits) {
              if (iStack_54 != best) {
                __assert_fail("pvDepth == depth",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x109b,
                              "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                             );
              }
              depth_local = firstMove.bits;
            }
            else {
              iVar5 = this->checks;
              bVar1 = Move::IsCapOrPromo(pMStack_68);
              if (iVar5 == 0 && !bVar1) {
                DecHistory(pMStack_68);
              }
            }
          }
        }
        if (this->moveCount < 1) {
          __assert_fail("moveCount > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x10a3,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                       );
        }
        if (depth_local < (int)uStack_2c) {
          __assert_fail("best <= alpha",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x10a4,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                       );
        }
        if ((int)uStack_20 <= depth_local) {
          __assert_fail("alpha < beta",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x10a5,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                       );
        }
        if (0 < this->pvCount) {
          if (iStack_54 < 0) {
            __assert_fail("pvDepth >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x10a8,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                         );
          }
          bVar1 = Move::IsValid(this->pv);
          if (!bVar1) {
            __assert_fail("pv[0].IsValid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x10a9,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                         );
          }
          iVar5 = this->checks;
          bVar1 = Move::IsCapOrPromo(this->pv);
          if (iVar5 == 0 && !bVar1) {
            IncHistory(this->pv,best);
          }
          if (local_50 < (int)uStack_2c) {
            __assert_fail("pvNode",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x10ae,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                         );
          }
          if (depth_local != local_50) {
            __assert_fail("alpha == orig_alpha",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x10b6,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                         );
          }
          iVar5 = 0;
          if (0 < this->depthChange) {
            iVar5 = 8;
          }
          HashEntry::Set(_orig_alpha,this->positionKey,this->pv,depth_local,this->ply,iStack_54,3,
                         iVar5);
        }
        this_local._4_4_ = uStack_2c;
      }
      else {
        if (iStack_54 != best) {
          __assert_fail("pvDepth == depth",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x103a,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
                       );
        }
        AddKiller(this,(Move *)&entry,iStack_54);
        uVar4 = uStack_2c;
        if ((int)uStack_2c < 1) {
          uVar4 = -uStack_2c;
        }
        if ((int)uVar4 < 0x7919) {
          local_c0 = uStack_20;
        }
        else {
          local_c0 = uStack_2c;
        }
        firstMove.bits = local_c0;
        iVar5 = 0;
        if (0 < this->depthChange) {
          iVar5 = 8;
        }
        HashEntry::Set(_orig_alpha,this->positionKey,(Move *)&entry,local_c0,this->ply,iStack_54,5,
                       iVar5);
        this_local._4_4_ = uStack_2c;
      }
    }
    else {
      this_local._4_4_ = uStack_20;
    }
    return this_local._4_4_;
  }
  __assert_fail("!moveCount",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                ,0x1000,
                "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = true]"
               );
}

Assistant:

int Search(int alpha, int beta, int depth, const bool cutNode) {
    assert(parent);
    assert(ply > 0);
    assert(alpha < beta);
    assert(abs(alpha) <= Infinity);
    assert(abs(beta) <= Infinity);
    assert(depth > 0);
    assert((type == PV) | ((alpha + 1) == beta));
    assert(cutNode ? lastMove.IsValid() : true);

    _stats.snodes++;
    moveIndex   = 0;
    moveCount   = 0;
    pvCount     = 0;
    depthChange = 0;

    if (IsDraw()) {
      return (standPat = _drawScore[color]);
    }

    // mate distance pruning
    int best = (ply - Infinity);
    alpha = std::max<int>(best, alpha);
    beta = std::min<int>((Infinity - ply + 1), beta);
    if ((alpha >= beta) | !child) {
      return alpha;
    }

    // check extensions
    if (checks && (parent->depthChange <= 0)) {
      _stats.chkExts++;
      depthChange++;
      depth++;
    }

    const bool pvNode = (type == PV);
    int eval = Infinity;
    Move firstMove;

    // transposition table lookup
    HashEntry* entry = _tt.Get(positionKey);
    if (entry->Key() == positionKey) {
      _tt.IncHits();
      switch (entry->GetPrimaryFlag()) {
      case HashEntry::Checkmate: return (ply - Infinity);
      case HashEntry::Stalemate: return (standPat = _drawScore[color]);
      case HashEntry::UpperBound:
        firstMove.Init(entry->MoveBits(), entry->Score(ply));
        assert(ValidateMove<color>(firstMove) == 0);
        if (((!pvNode) | entry->HasPvFlag()) &&
            ((entry->Depth() >= depth) & (firstMove.GetScore() <= alpha)))
        {
          pv[0] = firstMove;
          pvCount = 1;
          return firstMove.GetScore();
        }
        eval = firstMove.GetScore();
        break;
      case HashEntry::ExactScore:
        firstMove.Init(entry->MoveBits(), entry->Score(ply));
        assert(ValidateMove<color>(firstMove) == 0);
        assert(entry->HasPvFlag());
        if ((entry->Depth() >= depth) &
            ((!pvNode) |
             (firstMove.GetScore() <= alpha) |
             (firstMove.GetScore() >= beta)))
        {
          pv[0] = firstMove;
          pvCount = 1;
          if (firstMove.GetScore() >= beta) {
            AddKiller(firstMove, depth);
          }
          else if ((!checks) & (firstMove.GetScore() > alpha) &
                   (!firstMove.IsCapOrPromo()))
          {
            IncHistory(firstMove, depth);
          }
          return firstMove.GetScore();
        }
        eval = firstMove.GetScore();
        break;
      case HashEntry::LowerBound:
        firstMove.Init(entry->MoveBits(), entry->Score(ply));
        assert(ValidateMove<color>(firstMove) == 0);
        if (((!pvNode) | entry->HasPvFlag()) &&
            ((entry->Depth() >= depth) & (firstMove.GetScore() >= beta)))
        {
          pv[0] = firstMove;
          pvCount = 1;
          AddKiller(firstMove, depth);
          return firstMove.GetScore();
        }
        break;
      default:
        assert(false);
      }
      if (((depthChange <= 0) & (parent->depthChange <= 0)) &&
          entry->HasExtendedFlag())
      {
        _stats.hashExts++;
        depthChange++;
        depth++;
      }
    }

    assert(depthChange >= 0);
    assert(!moveIndex);
    assert(!moveCount);
    assert(!pvCount);

    // forward pruning (the risky stuff)
    if ((cutNode & (!pvNode) & (!depthChange) & (!checks)) &&
        !IsKiller(lastMove) &&
        ((_pcount[color] + _pcount[color|Knight]) > 1) &&
        ((_pcount[color] + _pcount[color|Knight] + _pcount[color|Pawn] > 2)))
    {
      assert((alpha + 1) == beta);
      Evaluate();
      eval = std::min<int>(eval, standPat);

      // static null move pruning
      if (depth == 1) {
        if ((eval >= (beta + (3 * PawnValue))) & (abs(beta) < WinningScore)) {
          _stats.staticNM++;
          depthChange = -1;
          return beta;
        }
      }

      // null move pruning
      else if (eval >= beta) {
        ExecNullMove<color>(*child);
        const int rdepth = (depth - 3 - (depth / 6) - ((eval - 500) >= beta));
        eval = (rdepth > 0)
            ? -child->Search<NonPV, !color>(-beta, -alpha, rdepth, false)
            : -child->QSearch<!color>(-beta, -alpha, 0);
        if (_stop) {
          return beta;
        }
        if (eval >= beta) {
          _stats.nmCutoffs++;
          depthChange = -depth;
          return std::max<int>(standPat, beta); // do not return eval
        }
      }
    }

    assert(!moveIndex);
    assert(!moveCount);

    // internal iterative deepening
    if ((!firstMove) & (depth > 3)) {
      assert(!moveCount);
      assert(!pvCount);
      _stats.iidCount++;
      eval = Search<NonPV, color>((beta - 1), beta, (depth - 2), false);
      if (_stop | !pvCount) {
        return eval;
      }
      assert(moveCount > 0);
      assert(pvCount > 0);
      assert(pv[0].IsValid());
      firstMove = pv[0];
      moveIndex = 1;
    }

    // make sure firstMove is populated
    else if (!firstMove) {
      assert(!moveCount);
      assert(!pvCount);
      GenerateMoves<color, false>(depth);
      if (moveCount <= 0) {
        if (checks) {
          entry->SetCheckmate(positionKey);
          _tt.IncCheckmates();
          return (ply - Infinity);
        }
        entry->SetStalemate(positionKey);
        _tt.IncStalemates();
        return (standPat = _drawScore[color]);
      }

      firstMove = *GetNextMove();
      assert(moveIndex == 1);
    }

    // single reply extensions
    if ((moveCount == 1) & (depthChange <= 0) & (parent->depthChange <= 0)) {
      _stats.oneReplyExts++;
      depthChange++;
      depth++;
    }

    // search first move with full alpha/beta window
    const int orig_alpha = alpha;
    Exec<color>(firstMove, *child);
    best = (depth > 1)
        ? -child->Search<type, !color>(-beta, -alpha, (depth - 1), !cutNode)
        : -child->QSearch<!color>(-beta, -alpha, 0);
    Undo<color>(firstMove);
    if (_stop) {
      return beta;
    }
    int pvDepth = (depth + std::min<int>(0, child->depthChange));
    UpdatePV(firstMove);
    if (best >= beta) {
      assert(pvDepth == depth);
      AddKiller(firstMove, pvDepth);
      eval = ((abs(best) > MateScore) ? best : beta);
      entry->Set(positionKey, firstMove, eval, ply, pvDepth,
                 HashEntry::LowerBound,
                 (((depthChange > 0) ? HashEntry::Extended : 0) |
                  (pvNode ? HashEntry::FromPV : 0)));
      return best;
    }
    if (best > alpha) {
      assert(pvDepth == depth);
      alpha = best;
    }
    else if (!(checks | firstMove.IsCapOrPromo())) {
      DecHistory(firstMove);
    }

    // generate moves if we haven't done so already
    if (moveCount <= 0) {
      GenerateMoves<color, false>(depth);
      assert(moveCount > 0);
      assert((moveCount == 1) ? (moves[0] == firstMove) : true);
    }

    assert(moveIndex <= 1);
    assert(moveIndex <= moveCount);

    // search remaining moves
    const bool lmrOK = ((!pvNode) & (depth > 2) & (!checks));
    Move* move;
    while ((move = GetNextMove())) {
      assert(move->IsValid());
      if (firstMove == (*move)) {
        continue;
      }

      _stats.lateMoves++;
      Exec<color>(*move, *child);

      // late move reductions
      int d = (depth - 1);
      if (lmrOK) {
        _stats.lmCandidates++;
        if (!(move->IsCapOrPromo() | IsKiller(*move) | child->checks) &&
            (_hist[move->TypeToIndex()] < depth))
        {
          _stats.lmReductions++;
          d -= (1 + (_hist[move->TypeToIndex()] < 0));
        }
      }

      // first search with a null window to quickly see if it improves alpha
      eval = (d > 0)
          ? -child->Search<NonPV, !color>(-(alpha + 1), -alpha, d, true)
          : -child->QSearch<!color>(-(alpha + 1), -alpha, 0);

      // re-search it?
      if ((!_stop) & (eval > alpha)) {
        assert(child->depthChange >= 0);
        _stats.lmAlphaIncs++;
        if (pvNode) {
          assert(d == (depth - 1));
          _stats.lmResearches++;
          eval = (d > 0)
              ? -child->Search<PV, !color>(-beta, -alpha, d, false)
              : -child->QSearch<!color>(-beta, -alpha, 0);
        }
        else if (d < (depth - 1)) {
          assert((alpha + 1) == beta);
          _stats.lmResearches++;
          d = (depth - 1);
          eval = -child->Search<NonPV, !color>(-beta, -alpha, d, false);
        }
        _stats.lmConfirmed += (eval > alpha);
      }

      assert((depth + child->depthChange) >= 0);
      Undo<color>(*move);
      if (_stop) {
        return beta;
      }
      if (eval > best) {
        best = eval;
        pvDepth = (depth + std::min<int>(0, child->depthChange));
        UpdatePV(*move);
        if (eval >= beta) {
          assert(pvDepth == depth);
          AddKiller(*move, pvDepth);
          eval = ((abs(best) > MateScore) ? best : beta);
          entry->Set(positionKey, *move, eval, ply, pvDepth,
                     HashEntry::LowerBound,
                     (((depthChange > 0) ? HashEntry::Extended : 0) |
                      (pvNode ? HashEntry::FromPV : 0)));
          return best;
        }
      }
      if (eval > alpha) {
        assert(pvDepth == depth);
        alpha = eval;
      }
      else if (!(checks | move->IsCapOrPromo())) {
        DecHistory(*move);
      }
    }

    assert(moveCount > 0);
    assert(best <= alpha);
    assert(alpha < beta);

    if (pvCount > 0) {
      assert(pvDepth >= 0);
      assert(pv[0].IsValid());
      if (!(checks | pv[0].IsCapOrPromo())) {
        IncHistory(pv[0], depth);
      }
      if (best > orig_alpha) {
        assert(pvNode);
        assert(pvDepth == depth);
        entry->Set(positionKey, pv[0], best, ply, pvDepth,
            HashEntry::ExactScore,
            (((depthChange > 0) ? HashEntry::Extended : 0) |
             HashEntry::FromPV));
      }
      else {
        assert(alpha == orig_alpha);
        entry->Set(positionKey, pv[0], alpha, ply, pvDepth,
            HashEntry::UpperBound,
            (((depthChange > 0) ? HashEntry::Extended : 0) |
             (pvNode ? HashEntry::FromPV : 0)));
      }
    }

    return best;
  }